

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-domain-socket-client.c
# Opt level: O3

int main(void)

{
  int __fd;
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  ulong uVar4;
  char *__s;
  char buff [8192];
  undefined1 local_2086 [22];
  undefined8 uStack_2070;
  undefined8 local_2068;
  undefined8 uStack_2060;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  undefined8 uStack_2040;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  char local_2018 [8200];
  
  __fd = socket(1,2,0);
  if (__fd < 0) {
    perror("socket");
    goto LAB_00101350;
  }
  local_2028 = 0;
  uStack_2020 = 0;
  local_2038 = 0;
  uStack_2030 = 0;
  local_2048 = 0;
  uStack_2040 = 0;
  local_2058 = 0;
  uStack_2050 = 0;
  local_2068 = 0;
  uStack_2060 = 0;
  local_2086._14_8_ = 0;
  uStack_2070 = 0;
  local_2086._0_2_ = 1;
  local_2086[2] = 'c';
  local_2086[3] = 'l';
  local_2086[4] = 'i';
  local_2086[5] = 'e';
  local_2086[6] = 'n';
  local_2086[7] = 't';
  local_2086[8] = '.';
  local_2086[9] = 's';
  local_2086[10] = 'o';
  local_2086[0xb] = 'c';
  local_2086[0xc] = 'k';
  local_2086[0xd] = '\0';
  unlink("client.sock");
  iVar1 = bind(__fd,(sockaddr *)local_2086,0x6e);
  if (iVar1 < 0) {
    __s = "bind";
LAB_00101387:
    perror(__s);
  }
  else {
    local_2028 = 0;
    uStack_2020 = 0;
    local_2038 = 0;
    uStack_2030 = 0;
    local_2048 = 0;
    uStack_2040 = 0;
    local_2058 = 0;
    uStack_2050 = 0;
    local_2068 = 0;
    uStack_2060 = 0;
    local_2086._14_8_ = 0;
    uStack_2070 = 0;
    local_2086._0_2_ = 1;
    local_2086[2] = 's';
    local_2086[3] = 'e';
    local_2086[4] = 'r';
    local_2086[5] = 'v';
    local_2086[6] = 'e';
    local_2086[7] = 'r';
    local_2086[8] = '.';
    local_2086[9] = 's';
    local_2086[10] = 'o';
    local_2086[0xb] = 'c';
    local_2086[0xc] = 'k';
    local_2086[0xd] = '\0';
    iVar1 = connect(__fd,(sockaddr *)local_2086,0x6e);
    if (iVar1 == -1) {
      __s = "connect";
      goto LAB_00101387;
    }
    builtin_strncpy(local_2018,"iccExchangeAPDU",0x10);
    sVar2 = strlen(local_2018);
    sVar3 = send(__fd,local_2018,sVar2 + 1,0);
    if (sVar3 == -1) {
      main_cold_1();
    }
    else {
      puts("sent iccExchangeAPDU");
      uVar4 = recv(__fd,local_2018,0x2000,0);
      if ((int)uVar4 < 0) {
        perror("recv");
      }
      printf("receive %d %s\n",uVar4 & 0xffffffff,local_2018);
    }
  }
  close(__fd);
LAB_00101350:
  unlink("client.sock");
  return 0;
}

Assistant:

int main() {
    int fd;
    struct sockaddr_un addr;
    int ret;
    char buff[8192];
    struct sockaddr_un from;
    int ok = 1;
    int len;
    
    //////********* UNIX domain  *********//////////
    ///// UNIX domain sockets are a method by which processes on the same host can communicate. 
    /////Communication is bidirectional with stream sockets and unidirectional with datagram sockets.
    
    // i.e fd = socket(AF_UNIX, SOCK_STREAM, 0);
    
    /// PF= Protocol family: Unix domain sockets  PF_UNIX=AF_UNIX
    //NOTE: SOCK_DGRAM socket datagram type communication. other type stream
    if ((fd = socket(PF_UNIX, SOCK_DGRAM, 0)) < 0) {
        perror("socket");
        ok = 0;
    }

    if (ok) {
        memset(&addr, 0, sizeof(addr));
        ///  AF=Address familu UNIX
        addr.sun_family = AF_UNIX;
        ////// path name = client.sock
        strcpy(addr.sun_path, CLIENT_SOCK_FILE);
        // unlink() - delete name and if it's possible the file which is referring for by the name.
        unlink(CLIENT_SOCK_FILE);
        //// int bind (int fd, const struct sockaddr *addr, int addrlen)
        ////  link the socket using the file descriptor a local or a network Address, memorized into addr.
        
        if (bind(fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
            perror("bind");
            ok = 0;
        }
    }

    if (ok) {
        memset(&addr, 0, sizeof(addr));
        ///  AF=Address familu UNIX
        addr.sun_family = AF_UNIX;
        ////// path name = server.sock
        strcpy(addr.sun_path, SERVER_SOCK_FILE);
        /// int connect (int fd, const struct sockaddr *addr,int addrlen), 
        ///try to connet to a specific socket created by the client, using the address specified into the addr structure
        if (connect(fd, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
            perror("connect");
            ok = 0;
        }
    }

    if (ok) {
        strcpy (buff, "iccExchangeAPDU");
        //// ssize_t send(int sockfd, const void *buf, size_t len, int flags);  you could use the write function since it's possible use the generic file descriptor
        if (send(fd, buff, strlen(buff)+1, 0) == -1) {
            perror("send");
            ok = 0;
        }
        printf ("sent iccExchangeAPDU\n");
    }

    if (ok) {
        //// ssize_t recv(int sockfd, void *buf, size_t len, int flags);  you could use the read function since it's possible use the generic file descriptor
        if ((len = recv(fd, buff, 8192, 0)) < 0) {
            perror("recv");
            ok = 0;
        }
        printf ("receive %d %s\n", len, buff);
    }

    if (fd >= 0) {
        // close file descriptor
        close(fd);
    }
    // unlink() - delete name and if it's possible the file which is referring for by the name.
    unlink (CLIENT_SOCK_FILE);
    return 0;
}